

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmTrapcc<(moira::Instr)172,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  Av<(moira::Instr)172,_(moira::Mode)12,_4> local_50;
  Imu<4> local_4c;
  int local_48;
  u32 local_40;
  u32 ext_1;
  Ims<4> local_34;
  int local_30;
  u32 local_28;
  u16 local_22;
  u32 ext;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  SVar1 = str->style->syntax;
  local_22 = op;
  _ext = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  if (SVar1 == GNU || SVar1 == GNU_MIT) {
    local_28 = dasmIncRead<4>(this,addr);
    pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
    pSVar2 = StrWriter::operator<<(pSVar2);
    local_30 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_30);
    Ims<4>::Ims(&local_34,local_28);
    StrWriter::operator<<(pSVar2,local_34);
  }
  else {
    local_40 = dasmIncRead<4>(this,addr);
    pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
    local_48 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_48);
    Imu<4>::Imu(&local_4c,local_40);
    StrWriter::operator<<(pSVar2,local_4c);
  }
  local_50.ext1 = 0;
  StrWriter::operator<<((StrWriter *)addr_local,&local_50);
  return;
}

Assistant:

void
Moira::dasmTrapcc(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (S) {

                case Byte:

                    str << Ins<I>{};
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(ext);
                    break;
            }
            break;

        default:

            switch (S) {

                case Byte:

                    str << Ins<I>{} << str.tab;
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << str.tab << Imu(ext);
                    break;
            }
    }

    str << Av<I, M, S>{};
}